

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-record.c
# Opt level: O3

void big_record_type_clear(BigRecordType *rtype)

{
  long lVar1;
  ulong uVar2;
  
  if (rtype->nfield != 0) {
    lVar1 = 0;
    uVar2 = 0;
    do {
      free(*(void **)(rtype->fields->dtype + lVar1 + -8));
      uVar2 = uVar2 + 1;
      lVar1 = lVar1 + 0x20;
    } while (uVar2 < rtype->nfield);
  }
  free(rtype->fields);
  rtype->fields = (BigRecordField *)0x0;
  rtype->nfield = 0;
  return;
}

Assistant:

void
big_record_type_clear(BigRecordType * rtype)
{
    int i;
    for(i = 0; i < rtype->nfield; i ++) {
        free(rtype->fields[i].name);
    }
    free(rtype->fields);
    rtype->nfield = 0;
    rtype->fields = NULL;
}